

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestLaunch.cxx
# Opt level: O3

void __thiscall cmCTestLaunch::WriteXMLResult(cmCTestLaunch *this,cmXMLWriter *xml)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmsysProcess *cp;
  int iVar2;
  string local_38;
  
  cmXMLWriter::Comment(xml,"Result of command");
  paVar1 = &local_38.field_2;
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"Result","");
  cmXMLWriter::StartElement(xml,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"StdOut","");
  cmXMLWriter::StartElement(xml,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  DumpFileToXML(this,xml,&this->LogOut);
  cmXMLWriter::EndElement(xml);
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"StdErr","");
  cmXMLWriter::StartElement(xml,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  DumpFileToXML(this,xml,&this->LogErr);
  cmXMLWriter::EndElement(xml);
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"ExitCondition","");
  cmXMLWriter::StartElement(xml,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  cp = this->Process;
  iVar2 = cmsysProcess_GetState(cp);
  switch(iVar2) {
  case 0:
    cmXMLWriter::Content<char[29]>(xml,(char (*) [29])"No process has been executed");
    break;
  case 1:
    cmXMLWriter::Content<char[37]>(xml,(char (*) [37])"Error administrating child process: ");
    local_38._M_dataplus._M_p = cmsysProcess_GetErrorString(cp);
    goto LAB_0029115a;
  case 2:
    cmXMLWriter::Content<char[24]>(xml,(char (*) [24])"Terminated abnormally: ");
    local_38._M_dataplus._M_p = cmsysProcess_GetExceptionString(cp);
LAB_0029115a:
    cmXMLWriter::Content<char_const*>(xml,(char **)&local_38);
    break;
  case 3:
    cmXMLWriter::Content<char[31]>(xml,(char (*) [31])"The process is still executing");
    break;
  case 4:
    cmXMLWriter::PreContent(xml);
    std::ostream::operator<<(xml->Output,this->ExitCode);
    break;
  case 5:
    cmXMLWriter::Content<char[28]>(xml,(char (*) [28])"Killed when timeout expired");
    break;
  case 6:
    cmXMLWriter::Content<char[17]>(xml,(char (*) [17])"Killed by parent");
    break;
  case 7:
    cmXMLWriter::Content<char[9]>(xml,(char (*) [9])"Disowned");
  }
  cmXMLWriter::EndElement(xml);
  cmXMLWriter::EndElement(xml);
  return;
}

Assistant:

void cmCTestLaunch::WriteXMLResult(cmXMLWriter& xml)
{
  xml.Comment("Result of command");
  xml.StartElement("Result");

  // StdOut
  xml.StartElement("StdOut");
  this->DumpFileToXML(xml, this->LogOut);
  xml.EndElement(); // StdOut

  // StdErr
  xml.StartElement("StdErr");
  this->DumpFileToXML(xml, this->LogErr);
  xml.EndElement(); // StdErr

  // ExitCondition
  xml.StartElement("ExitCondition");
  cmsysProcess* cp = this->Process;
  switch (cmsysProcess_GetState(cp))
    {
    case cmsysProcess_State_Starting:
      xml.Content("No process has been executed"); break;
    case cmsysProcess_State_Executing:
      xml.Content("The process is still executing"); break;
    case cmsysProcess_State_Disowned:
      xml.Content("Disowned"); break;
    case cmsysProcess_State_Killed:
      xml.Content("Killed by parent"); break;

    case cmsysProcess_State_Expired:
      xml.Content("Killed when timeout expired"); break;
    case cmsysProcess_State_Exited:
      xml.Content(this->ExitCode); break;
    case cmsysProcess_State_Exception:
      xml.Content("Terminated abnormally: ");
      xml.Content(cmsysProcess_GetExceptionString(cp)); break;
    case cmsysProcess_State_Error:
      xml.Content("Error administrating child process: ");
      xml.Content(cmsysProcess_GetErrorString(cp)); break;
    };
  xml.EndElement(); // ExitCondition

  xml.EndElement(); // Result
}